

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

void __thiscall Cholesky_solve_Test::TestBody(Cholesky_solve_Test *this)

{
  float expected;
  bool bVar1;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar2;
  CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_> *pCVar3;
  Scalar *pSVar4;
  char *message;
  AssertHelper local_278;
  Message local_270;
  undefined1 local_268 [8];
  AssertionResult gtest_ar;
  int j;
  int i;
  DenseMatrixType local_244;
  MatrixTypeNested local_220;
  DenseMatrixType local_214;
  Product<Eigen::Matrix<float,_4,_3,_0,_4,_3>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> local_1f0;
  Product<Eigen::Product<Eigen::Matrix<float,_4,_3,_0,_4,_3>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<float,_3,_3,_1,_3,_3>,_0>
  local_1e0;
  Matrix<float,4,3,0,4,3> local_1c8 [8];
  Matrix<T,_4,_3> P_;
  Solve<Eigen::LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>,_Eigen::Transpose<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>_>
  local_190;
  non_const_type local_180;
  Scalar local_170;
  Scalar local_16c;
  Scalar local_168;
  Scalar local_164;
  Scalar local_160;
  Scalar local_15c;
  Scalar local_158;
  Scalar local_154;
  Scalar local_150;
  Scalar local_14c;
  Scalar local_148;
  Scalar local_144;
  CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_> local_140;
  undefined1 local_120 [8];
  Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> S;
  Scalar local_e8;
  Scalar local_e4;
  Scalar local_e0;
  Scalar local_dc;
  Scalar local_d8 [4];
  Scalar local_c8;
  Scalar local_c4;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_c0;
  DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_9c [8];
  Matrix<T,_3,_3> S_;
  Matrix<T,_4,_3> P;
  Matrix<T,_4,_3> K;
  Cholesky_solve_Test *this_local;
  
  Eigen::Matrix<float,_4,_3,_0,_4,_3>::Matrix
            ((Matrix<float,_4,_3,_0,_4,_3> *)
             (P.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array +
             10));
  Eigen::Matrix<float,_4,_3,_0,_4,_3>::Matrix
            ((Matrix<float,_4,_3,_0,_4,_3> *)
             (S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             + 7));
  Eigen::Matrix<float,_3,_3,_0,_3,_3>::Matrix((Matrix<float,_3,_3,_0,_3,_3> *)local_9c);
  local_c4 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator<<(&local_c0,local_9c,&local_c4);
  local_c8 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (&local_c0,&local_c8);
  local_d8[0] = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar2,local_d8)
  ;
  local_dc = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_dc);
  local_e0 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_e0);
  local_e4 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_e4);
  local_e8 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_e8);
  S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info = 0x3f800000;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,(Scalar *)&S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info);
  S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized = false;
  S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._41_3_ = 0x400000;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
            (pCVar2,(Scalar *)&S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_c0);
  Kalman::Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::Cholesky
            ((Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)local_120);
  Kalman::Cholesky<Eigen::Matrix<float,3,3,0,3,3>,1>::setL<Eigen::Matrix<float,3,3,0,3,3>>
            ((Cholesky<Eigen::Matrix<float,3,3,0,3,3>,1> *)local_120,
             (MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_9c);
  local_144 = 6.0;
  Eigen::DenseBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator<<
            (&local_140,
             (DenseBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_> *)
             (S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             + 7),&local_144);
  local_148 = 4.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                     (&local_140,&local_148);
  local_14c = 2.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                     (pCVar3,&local_14c);
  local_150 = 4.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                     (pCVar3,&local_150);
  local_154 = 8.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                     (pCVar3,&local_154);
  local_158 = 6.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                     (pCVar3,&local_158);
  local_15c = 2.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                     (pCVar3,&local_15c);
  local_160 = 6.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                     (pCVar3,&local_160);
  local_164 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                     (pCVar3,&local_164);
  local_168 = 3.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                     (pCVar3,&local_168);
  local_16c = 5.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                     (pCVar3,&local_16c);
  local_170 = 7.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_(pCVar3,&local_170);
  Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::~CommaInitializer(&local_140);
  P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array._40_8_ =
       Eigen::DenseBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::transpose
                 ((DenseBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_> *)
                  (S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array + 7));
  local_190 = Eigen::SolverBase<Eigen::LLT<Eigen::Matrix<float,3,3,0,3,3>,1>>::
              solve<Eigen::Transpose<Eigen::Matrix<float,4,3,0,4,3>>>
                        ((SolverBase<Eigen::LLT<Eigen::Matrix<float,3,3,0,3,3>,1>> *)local_120,
                         (MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>_> *)
                         (P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.
                          m_data.array + 10));
  local_180 = (non_const_type)
              Eigen::
              DenseBase<Eigen::Solve<Eigen::LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>,_Eigen::Transpose<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>_>_>
              ::transpose((DenseBase<Eigen::Solve<Eigen::LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>,_Eigen::Transpose<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>_>_>
                           *)&local_190);
  Eigen::Matrix<float,4,3,0,4,3>::operator=
            ((Matrix<float,4,3,0,4,3> *)
             (P.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array +
             10),(DenseBase<Eigen::Transpose<const_Eigen::Solve<Eigen::LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>,_Eigen::Transpose<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>_>_>_>
                  *)&local_180);
  local_220 = (MatrixTypeNested)
              Eigen::LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::matrixL
                        ((LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)local_120);
  Eigen::TriangularBase<Eigen::TriangularView<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1U>_>::
  toDenseMatrix(&local_214,
                (TriangularBase<Eigen::TriangularView<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1U>_>
                 *)&local_220);
  local_1f0 = Eigen::MatrixBase<Eigen::Matrix<float,4,3,0,4,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<float,4,3,0,4,3>> *)
                         (P.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.
                          m_data.array + 10),
                         (MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&local_214);
  _j = Eigen::LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::matrixU
                 ((LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)local_120);
  Eigen::
  TriangularBase<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_2U>_>
  ::toDenseMatrix(&local_244,
                  (TriangularBase<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_2U>_>
                   *)&j);
  Eigen::MatrixBase<Eigen::Product<Eigen::Matrix<float,4,3,0,4,3>,Eigen::Matrix<float,3,3,0,3,3>,0>>
  ::operator*(&local_1e0,
              (MatrixBase<Eigen::Product<Eigen::Matrix<float,4,3,0,4,3>,Eigen::Matrix<float,3,3,0,3,3>,0>>
               *)&local_1f0,(MatrixBase<Eigen::Matrix<float,_3,_3,_1,_3,_3>_> *)&local_244);
  Eigen::Matrix<float,4,3,0,4,3>::
  Matrix<Eigen::Product<Eigen::Product<Eigen::Matrix<float,4,3,0,4,3>,Eigen::Matrix<float,3,3,0,3,3>,0>,Eigen::Matrix<float,3,3,1,3,3>,0>>
            (local_1c8,
             (EigenBase<Eigen::Product<Eigen::Product<Eigen::Matrix<float,_4,_3,_0,_4,_3>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<float,_3,_3,_1,_3,_3>,_0>_>
              *)&local_1e0);
  for (gtest_ar.message_.ptr_._4_4_ = 0; gtest_ar.message_.ptr_._4_4_ < 4;
      gtest_ar.message_.ptr_._4_4_ = gtest_ar.message_.ptr_._4_4_ + 1) {
    for (gtest_ar.message_.ptr_._0_4_ = 0; (int)gtest_ar.message_.ptr_ < 3;
        gtest_ar.message_.ptr_._0_4_ = (int)gtest_ar.message_.ptr_ + 1) {
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>,_1> *)
                          (S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array + 7),(long)gtest_ar.message_.ptr_._4_4_,
                          (long)(int)gtest_ar.message_.ptr_);
      expected = *pSVar4;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>,_1> *)local_1c8,
                          (long)gtest_ar.message_.ptr_._4_4_,(long)(int)gtest_ar.message_.ptr_);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)local_268,"P(i,j)","P_(i,j)",expected,*pSVar4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
      if (!bVar1) {
        testing::Message::Message(&local_270);
        message = testing::AssertionResult::failure_message((AssertionResult *)local_268);
        testing::internal::AssertHelper::AssertHelper
                  (&local_278,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/Matrix.cpp"
                   ,0x23,message);
        testing::internal::AssertHelper::operator=(&local_278,&local_270);
        testing::internal::AssertHelper::~AssertHelper(&local_278);
        testing::Message::~Message(&local_270);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
      if (!bVar1) goto LAB_0041b000;
    }
  }
LAB_0041b000:
  Kalman::Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::~Cholesky
            ((Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)local_120);
  return;
}

Assistant:

TEST(Cholesky, solve) {
    Matrix<T, 4, 3> K;
    Matrix<T, 4, 3> P;
    
    // Set S (lower choleksy factor)
    Matrix<T,3,3> S_;
    S_ << 1, 0, 0, 1, 1, 0, 1, 1, 2;
    
    Cholesky<Matrix<T,3,3>> S;
    S.setL(S_);
    
    // Set P
    P << 6, 4, 2, 4, 8, 6, 2, 6, 0, 3, 5, 7;
    
    // Compute K
    K = S.solve(P.transpose()).transpose();

    Matrix<T, 4, 3> P_ = K * S.matrixL().toDenseMatrix() * S.matrixU().toDenseMatrix();
    
    for(int i = 0; i < 4; i++)
    {
        for(int j = 0; j < 3; j++)
        {
            ASSERT_FLOAT_EQ( P(i,j), P_(i,j) );
        }
    }
}